

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::get(application_specific_pool *this,service *srv)

{
  _data *p_Var1;
  _policy *p_Var2;
  undefined8 in_RDX;
  long in_RSI;
  application *in_RDI;
  unique_lock<std::recursive_mutex> g;
  intrusive_ptr<cppcms::application> *app;
  mutex_type *in_stack_ffffffffffffff58;
  unique_lock<std::recursive_mutex> *in_stack_ffffffffffffff60;
  application *in_stack_ffffffffffffff68;
  intrusive_ptr<cppcms::application> *in_stack_ffffffffffffff70;
  undefined1 local_50 [8];
  undefined1 local_48 [47];
  undefined1 local_19;
  undefined8 local_18;
  
  local_18 = in_RDX;
  p_Var1 = booster::hold_ptr<cppcms::application_specific_pool::_data>::operator->
                     ((hold_ptr<cppcms::application_specific_pool::_data> *)(in_RSI + 0x18));
  if (p_Var1->flags == -1) {
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
  }
  else {
    local_19 = 0;
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              ((intrusive_ptr<cppcms::application> *)in_RDI);
    p_Var1 = booster::hold_ptr<cppcms::application_specific_pool::_data>::operator->
                       ((hold_ptr<cppcms::application_specific_pool::_data> *)(in_RSI + 0x18));
    p_Var2 = booster::hold_ptr<cppcms::application_specific_pool::_policy>::operator->
                       (&p_Var1->policy);
    if ((p_Var2->lock_on_get_put & 1U) == 0) {
      p_Var1 = booster::hold_ptr<cppcms::application_specific_pool::_data>::operator->
                         ((hold_ptr<cppcms::application_specific_pool::_data> *)(in_RSI + 0x18));
      p_Var2 = booster::hold_ptr<cppcms::application_specific_pool::_policy>::operator->
                         (&p_Var1->policy);
      (*p_Var2->_vptr__policy[5])(local_50,p_Var2,local_18);
      booster::intrusive_ptr<cppcms::application>::operator=
                (in_stack_ffffffffffffff70,(intrusive_ptr<cppcms::application> *)p_Var1);
      booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
                ((intrusive_ptr<cppcms::application> *)p_Var2);
    }
    else {
      booster::hold_ptr<cppcms::application_specific_pool::_data>::operator->
                ((hold_ptr<cppcms::application_specific_pool::_data> *)(in_RSI + 0x18));
      std::unique_lock<std::recursive_mutex>::unique_lock
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      p_Var1 = booster::hold_ptr<cppcms::application_specific_pool::_data>::operator->
                         ((hold_ptr<cppcms::application_specific_pool::_data> *)(in_RSI + 0x18));
      p_Var2 = booster::hold_ptr<cppcms::application_specific_pool::_policy>::operator->
                         (&p_Var1->policy);
      (*p_Var2->_vptr__policy[5])(local_48,p_Var2,local_18);
      booster::intrusive_ptr<cppcms::application>::operator=
                ((intrusive_ptr<cppcms::application> *)p_Var2,
                 (intrusive_ptr<cppcms::application> *)in_stack_ffffffffffffff68);
      booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
                ((intrusive_ptr<cppcms::application> *)in_stack_ffffffffffffff60);
      std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_ffffffffffffff60);
    }
  }
  return (intrusive_ptr<cppcms::application>)in_RDI;
}

Assistant:

booster::intrusive_ptr<application> application_specific_pool::get(cppcms::service &srv)
{

	if(d->flags == -1)
		return 0;
	assert(d->policy.get());
	booster::intrusive_ptr<application> app;

	if(d->policy->lock_on_get_put) {
		booster::unique_lock<booster::recursive_mutex> g(d->lock);
		app = d->policy->get(srv);
	}
	else
		app = d->policy->get(srv);
	return app;
}